

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> * __thiscall
DistanceGraph::fw_neighbours_by_distance(DistanceGraph *this,sgNodeID_t n,int min_links)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  __first_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppVar4;
  reference pvVar5;
  int in_ECX;
  ulong in_RDX;
  long in_RSI;
  map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_RDI;
  pair<const_long,_std::vector<int,_std::allocator<int>_>_> *fn;
  iterator __end1_1;
  iterator __begin1_1;
  map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range1_1;
  Link *l;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  fndists;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *fnd;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  value_type in_stack_fffffffffffffee4;
  map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  _Self local_a0;
  _Self local_98;
  undefined1 *local_90;
  reference local_78;
  Link *local_70;
  __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_68;
  const_reference local_60;
  undefined1 local_51;
  undefined1 local_50 [52];
  int local_1c;
  ulong local_18;
  
  this_00 = in_RDI;
  if (0 < in_ECX) {
    uVar2 = in_RDX;
    if ((long)in_RDX < 1) {
      uVar2 = -in_RDX;
    }
    local_1c = in_ECX;
    local_18 = in_RDX;
    sVar3 = std::
            vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
            ::size((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    *)(in_RSI + 8));
    if (uVar2 < sVar3) {
      std::
      map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::map((map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)0x38ed09);
      local_51 = 0;
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::vector
                ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)0x38ed1b);
      uVar2 = local_18;
      if ((long)local_18 < 1) {
        uVar2 = -local_18;
      }
      local_60 = std::
                 vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                               *)(in_RSI + 8),uVar2);
      local_68._M_current =
           (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                             ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffec8);
      local_70 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                   ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffec8
                                   );
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                 *)in_stack_fffffffffffffed0,
                                (__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                 *)in_stack_fffffffffffffec8), bVar1) {
        local_78 = __gnu_cxx::
                   __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                   operator*(&local_68);
        if (local_78->source == -local_18) {
          std::
          map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::operator[](this_00,(key_type *)in_RDI);
          std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     &(in_stack_fffffffffffffed8._M_current)->first);
        }
        __gnu_cxx::__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
        operator++(&local_68);
      }
      local_90 = local_50;
      local_98._M_node =
           (_Base_ptr)
           std::
           map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::begin((map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)in_stack_fffffffffffffec8);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::end((map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)in_stack_fffffffffffffec8);
      while (bVar1 = std::operator!=(&local_98,&local_a0), bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>
                              *)0x38ee9d);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&ppVar4->second);
        if ((ulong)(long)local_1c <= sVar3) {
          std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffec8);
          std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
          __first._M_current._4_4_ = in_stack_fffffffffffffee4;
          __first._M_current._0_4_ = in_stack_fffffffffffffee0;
          std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             in_stack_fffffffffffffed8._M_current);
          sVar3 = std::vector<int,_std::allocator<int>_>::size(&ppVar4->second);
          if ((sVar3 & 1) == 0) {
            in_stack_fffffffffffffed0 = &ppVar4->second;
            sVar3 = std::vector<int,_std::allocator<int>_>::size(in_stack_fffffffffffffed0);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_fffffffffffffed0,(sVar3 >> 1) - 1);
            in_stack_fffffffffffffee4 = *pvVar5;
            in_stack_fffffffffffffed8._M_current = (pair<int,_long> *)&ppVar4->second;
            sVar3 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_fffffffffffffed8._M_current);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8._M_current,
                       sVar3 >> 1);
            std::make_pair<int,long_const&>
                      ((int *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8);
            std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            emplace_back<std::pair<int,long>>
                      ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8._M_current);
          }
          else {
            in_stack_fffffffffffffec8 = &ppVar4->second;
            sVar3 = std::vector<int,_std::allocator<int>_>::size(in_stack_fffffffffffffec8);
            std::vector<int,_std::allocator<int>_>::operator[](in_stack_fffffffffffffec8,sVar3 >> 1)
            ;
            std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            emplace_back<int&,long_const&>
                      ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       &(in_stack_fffffffffffffed8._M_current)->first,
                       (long *)in_stack_fffffffffffffed0);
          }
        }
        std::_Rb_tree_iterator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++((_Rb_tree_iterator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffffed0);
      }
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::begin
                ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                 in_stack_fffffffffffffec8);
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::end
                ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                 in_stack_fffffffffffffec8);
      __first_00._M_current._4_4_ = in_stack_fffffffffffffee4;
      __first_00._M_current._0_4_ = in_stack_fffffffffffffee0;
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,long>*,std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>>>
                (__first_00,in_stack_fffffffffffffed8);
      local_51 = 1;
      std::
      map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~map((map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x38f089);
      return (vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)this_00;
    }
  }
  memset(in_RDI,0,0x18);
  std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::vector
            ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)0x38ecf7);
  return (vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)this_00;
}

Assistant:

std::vector<std::pair<int,sgNodeID_t>> DistanceGraph::fw_neighbours_by_distance(sgNodeID_t n, int min_links) const {
    if (min_links<1 or llabs(n)>=links.size()) return {};
    std::map<sgNodeID_t,std::vector<int>> fndists;//neighbour and all distances to it
    std::vector<std::pair<int,sgNodeID_t>> fnd; //median distance and neighbours if with min_links
    //ndists[dest] -> [dist1, dist2, dist3...]
    for (auto &l:links[llabs(n)]){
        if (l.source==-n){
            fndists[l.dest].emplace_back(l.dist);
        }
    }
    //fnd <- [(median2, n1),(median2,n2)...]
    for (auto &fn:fndists){
        if (fn.second.size()>=min_links){
            std::sort(fn.second.begin(),fn.second.end());
            if (fn.second.size()%2==0) fnd.emplace_back(std::make_pair((fn.second[fn.second.size()/2-1]+fn.second[fn.second.size()/2])/2,fn.first));
            else fnd.emplace_back(fn.second[fn.second.size()/2],fn.first);
        }
    }
    std::sort(fnd.begin(),fnd.end());
    return fnd;
}